

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_13be9a::TwoValuesWithHashCollision::SetUp(TwoValuesWithHashCollision *this)

{
  TwoValuesWithHashCollision *pTVar1;
  uint64_t uVar2;
  uint in_ECX;
  hash_function *this_00;
  allocator local_52;
  allocator local_51;
  string local_50;
  string local_30;
  
  testing::Test::SetUp((Test *)this);
  std::__cxx11::string::string((string *)&local_30,"a",&local_51);
  this_00 = &this->hash_;
  pTVar1 = (TwoValuesWithHashCollision *)hash_function::operator()(this_00,&local_30);
  std::__cxx11::string::string((string *)&local_50,"b",&local_52);
  uVar2 = hash_function::operator()(this_00,&local_50);
  check_collision(pTVar1,uVar2,1,in_ECX);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string((string *)&local_30,"a",&local_51);
  pTVar1 = (TwoValuesWithHashCollision *)hash_function::operator()(this_00,&local_30);
  std::__cxx11::string::string((string *)&local_50,"c",&local_52);
  uVar2 = hash_function::operator()(this_00,&local_50);
  check_collision(pTVar1,uVar2,1,in_ECX);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string((string *)&local_30,"e",&local_51);
  pTVar1 = (TwoValuesWithHashCollision *)hash_function::operator()(this_00,&local_30);
  std::__cxx11::string::string((string *)&local_50,"f",&local_52);
  uVar2 = hash_function::operator()(this_00,&local_50);
  check_collision(pTVar1,uVar2,10,in_ECX);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void SetUp () final {
            GenericIndexFixture::SetUp ();
            this->check_collision (hash_ ("a"), hash_ ("b"), 1);
            this->check_collision (hash_ ("a"), hash_ ("c"), 1);
            this->check_collision (hash_ ("e"), hash_ ("f"), 10);
        }